

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode hostname_check(Curl_URL *u,char *hostname,size_t hlen)

{
  bool bVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  char local_98 [8];
  char norm [46];
  char dest [16];
  char *h;
  char local_48 [4];
  int i;
  char zoneid [16];
  char *l;
  size_t len;
  size_t hlen_local;
  char *hostname_local;
  Curl_URL *u_local;
  
  if (*hostname == '\0') {
    return CURLUE_NO_HOST;
  }
  if (*hostname == '[') {
    zoneid._8_8_ = anon_var_dwarf_18238ce;
    if (hlen < 4) {
      return CURLUE_BAD_IPV6;
    }
    __s = hostname + 1;
    len = hlen - 2;
    if (__s[len] != ']') {
      return CURLUE_BAD_IPV6;
    }
    sVar3 = strspn(__s,"0123456789abcdefABCDEF:.");
    if (len != sVar3) {
      if (__s[sVar3] != '%') {
        return CURLUE_BAD_IPV6;
      }
      h._4_4_ = 0;
      dest._8_8_ = __s + sVar3 + 1;
      iVar2 = strncmp((char *)dest._8_8_,"25",2);
      if (((iVar2 == 0) && (*(char *)(dest._8_8_ + 2) != '\0')) &&
         (*(char *)(dest._8_8_ + 2) != ']')) {
        dest._8_8_ = dest._8_8_ + 2;
      }
      while( true ) {
        bVar1 = false;
        if ((*(char *)dest._8_8_ != '\0') && (bVar1 = false, *(char *)dest._8_8_ != ']')) {
          bVar1 = h._4_4_ < 0xf;
        }
        if (!bVar1) break;
        local_48[h._4_4_] = *(char *)dest._8_8_;
        dest._8_8_ = dest._8_8_ + 1;
        h._4_4_ = h._4_4_ + 1;
      }
      if ((h._4_4_ == 0) || (*(char *)dest._8_8_ != ']')) {
        return CURLUE_MALFORMED_INPUT;
      }
      local_48[h._4_4_] = '\0';
      pcVar4 = (*Curl_cstrdup)(local_48);
      u->zoneid = pcVar4;
      if (u->zoneid == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      __s[sVar3] = ']';
      hostname[sVar3 + 2] = '\0';
      len = sVar3;
    }
    __s[len] = '\0';
    iVar2 = inet_pton(10,__s,norm + 0x28);
    if (iVar2 != 1) {
      return CURLUE_BAD_IPV6;
    }
    pcVar4 = inet_ntop(10,norm + 0x28,local_98,0x2e);
    if ((pcVar4 != (char *)0x0) && (sVar3 = strlen(local_98), sVar3 < len)) {
      strcpy(__s,local_98);
      len = strlen(local_98);
      hostname[len + 2] = '\0';
    }
    __s[len] = ']';
  }
  else {
    sVar3 = strcspn(hostname," \r\n\t/:#?!@{}[]\\$\'\"^`*<>=;,");
    if (hlen != sVar3) {
      return CURLUE_BAD_HOSTNAME;
    }
  }
  return CURLUE_OK;
}

Assistant:

static CURLUcode hostname_check(struct Curl_URL *u, char *hostname,
                                size_t hlen) /* length of hostname */
{
  size_t len;
  DEBUGASSERT(hostname);

  if(!hostname[0])
    return CURLUE_NO_HOST;
  else if(hostname[0] == '[') {
    const char *l = "0123456789abcdefABCDEF:.";
    if(hlen < 4) /* '[::]' is the shortest possible valid string */
      return CURLUE_BAD_IPV6;
    hostname++;
    hlen -= 2;

    if(hostname[hlen] != ']')
      return CURLUE_BAD_IPV6;

    /* only valid letters are ok */
    len = strspn(hostname, l);
    if(hlen != len) {
      hlen = len;
      if(hostname[len] == '%') {
        /* this could now be '%[zone id]' */
        char zoneid[16];
        int i = 0;
        char *h = &hostname[len + 1];
        /* pass '25' if present and is a url encoded percent sign */
        if(!strncmp(h, "25", 2) && h[2] && (h[2] != ']'))
          h += 2;
        while(*h && (*h != ']') && (i < 15))
          zoneid[i++] = *h++;
        if(!i || (']' != *h))
          /* impossible to reach? */
          return CURLUE_MALFORMED_INPUT;
        zoneid[i] = 0;
        u->zoneid = strdup(zoneid);
        if(!u->zoneid)
          return CURLUE_OUT_OF_MEMORY;
        hostname[len] = ']'; /* insert end bracket */
        hostname[len + 1] = 0; /* terminate the hostname */
      }
      else
        return CURLUE_BAD_IPV6;
      /* hostname is fine */
    }
#ifdef ENABLE_IPV6
    {
      char dest[16]; /* fits a binary IPv6 address */
      char norm[MAX_IPADR_LEN];
      hostname[hlen] = 0; /* end the address there */
      if(1 != Curl_inet_pton(AF_INET6, hostname, dest))
        return CURLUE_BAD_IPV6;

      /* check if it can be done shorter */
      if(Curl_inet_ntop(AF_INET6, dest, norm, sizeof(norm)) &&
         (strlen(norm) < hlen)) {
        strcpy(hostname, norm);
        hlen = strlen(norm);
        hostname[hlen + 1] = 0;
      }
      hostname[hlen] = ']'; /* restore ending bracket */
    }
#endif
  }
  else {
    /* letters from the second string are not ok */
    len = strcspn(hostname, " \r\n\t/:#?!@{}[]\\$\'\"^`*<>=;,");
    if(hlen != len)
      /* hostname with bad content */
      return CURLUE_BAD_HOSTNAME;
  }
  return CURLUE_OK;
}